

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool from_issue_429::test_uintwide_t_spot_values_from_issue_429(void)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *out;
  size_type __n;
  bool local_312;
  allocator<unsigned_char> local_2c9;
  uchar auStack_2c8 [6];
  bool result_import_export_is_ok;
  undefined8 uStack_2c0;
  undefined1 local_2b8;
  iterator local_2a8;
  size_type local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  undefined1 local_279;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_278;
  bool result_export_is_ok;
  uchar *local_270;
  allocator<unsigned_char> local_261;
  undefined1 local_260 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> export_local;
  undefined1 local_240 [7];
  bool result_import_is_ok;
  string str_local;
  stringstream strm_local;
  undefined1 local_210 [376];
  uchar *local_98;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  undefined1 auStack_88 [8];
  local_uint_type p0_local;
  allocator<unsigned_char> local_49;
  uchar local_48 [24];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = 0xff;
  local_48[4] = 0xff;
  local_48[5] = 0xff;
  local_48[6] = 0xff;
  local_48[7] = 0xff;
  local_48[8] = 0xff;
  local_48[9] = 0xff;
  local_48[10] = '!';
  local_48[0xb] = 'b';
  local_48[0xc] = 0xff;
  local_48[0xd] = 0xff;
  local_48[0xe] = 0xff;
  local_48[0xf] = 0xff;
  local_48[0x10] = 0x21;
  local_30 = local_48;
  local_28 = 0x11;
  std::allocator<unsigned_char>::allocator(&local_49);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,__l_00,&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  p0_local.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
  auStack_88._0_4_ = 0;
  auStack_88._4_4_ = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_int,_void,_false> *)auStack_88);
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  local_98 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  math::wide_integer::
  import_bits<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_256U,_unsigned_int,_void,_nullptr>
            ((uintwide_t<256U,_unsigned_int,_void,_false> *)auStack_88,local_90,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_98,8,true);
  std::__cxx11::stringstream::stringstream((stringstream *)(str_local.field_2._M_local_buf + 8));
  out = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(local_210,std::hex)
  ;
  math::wide_integer::operator<<(out,(uintwide_t<256U,_unsigned_int,_void,_false> *)auStack_88);
  std::__cxx11::stringstream::str();
  export_local.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_240,"ffffffffffffff2162ffffffff21");
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  std::allocator<unsigned_char>::allocator(&local_261);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260,__n,&local_261);
  std::allocator<unsigned_char>::~allocator(&local_261);
  local_270 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260
                                 );
  _Stack_278 = math::wide_integer::
               export_bits<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_256U,_unsigned_int,_void,_false,_nullptr>
                         ((uintwide_t<256U,_unsigned_int,_void,_false> *)auStack_88,
                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_270,8,true);
  _auStack_2c8 = 0x21ffffffffffffff;
  uStack_2c0 = 0x21ffffffff62;
  local_2b8 = 0;
  local_2a8 = auStack_2c8;
  local_2a0 = 0x11;
  std::allocator<unsigned_char>::allocator(&local_2c9);
  __l._M_len = local_2a0;
  __l._M_array = local_2a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_298,__l,&local_2c9);
  bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260,
                          &local_298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_298);
  std::allocator<unsigned_char>::~allocator(&local_2c9);
  local_312 = false;
  if ((export_local.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    local_312 = bVar1;
  }
  local_279 = bVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_260);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::stringstream::~stringstream((stringstream *)(str_local.field_2._M_local_buf + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return local_312;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_429() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint_type = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint256_t;
    #else
    using local_uint_type = ::math::wide_integer::uint256_t;
    #endif

    const std::vector<std::uint8_t>
      input
      (
        {
          0x00, 0x00, 0x00, 0xff,
          0xff, 0xff, 0xff, 0xff,
          0xff, 0xff, 0x21, 0x62,
          0xff, 0xff, 0xff, 0xff,
          0x21
        }
    );

    local_uint_type p0_local { };

    // Import the data into the wide integer.
    import_bits
    (
      p0_local,
      input.cbegin(),
      input.cend(),
      static_cast<unsigned>(UINT8_C(8))
    );

    std::stringstream strm_local { };

    strm_local << std::hex << p0_local;

    const std::string str_local { strm_local.str() };

    const bool result_import_is_ok { str_local == "ffffffffffffff2162ffffffff21" };

    std::vector<std::uint8_t> export_local(input.size());

    export_bits(p0_local, export_local.begin(), static_cast<unsigned>(UINT8_C(8)));

    const bool result_export_is_ok
    {
      export_local == std::vector<std::uint8_t>( { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x21, 0x62, 0xff, 0xff, 0xff, 0xff, 0x21, 0x00, 0x00, 0x00 } )
    };

    const bool result_import_export_is_ok { result_import_is_ok && result_export_is_ok };

    return result_import_export_is_ok;
  }